

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_extend_frame(uint8_t *data,int width,int height,int stride,int border_horz,int border_vert,
                     int highbd)

{
  undefined2 *puVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  size_t __n;
  byte *pbVar20;
  void *__src;
  uint8_t *puVar21;
  long lVar22;
  int iVar24;
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar42;
  int iVar44;
  undefined1 auVar43 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar47 [16];
  
  auVar10 = _DAT_004d3310;
  auVar9 = _DAT_004d3300;
  auVar8 = _DAT_004d1710;
  auVar7 = _DAT_004d1700;
  auVar6 = _DAT_004d16f0;
  if (highbd == 0) {
    lVar16 = (long)stride;
    if (0 < height) {
      __n = (size_t)border_horz;
      uVar19 = (ulong)(uint)height;
      pbVar20 = data;
      do {
        memset(pbVar20 + -__n,(uint)*pbVar20,__n);
        memset(pbVar20 + width,(uint)pbVar20[(long)width + -1],__n);
        pbVar20 = pbVar20 + lVar16;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    if (0 < border_vert) {
      lVar22 = (long)border_horz;
      lVar11 = -(long)border_vert;
      puVar21 = data + -(border_vert * lVar16 + lVar22);
      do {
        lVar11 = lVar11 + 1;
        memcpy(puVar21,data + -lVar22,(long)(width + border_horz * 2));
        puVar21 = puVar21 + lVar16;
      } while ((int)lVar11 != 0);
      if (0 < border_vert) {
        lVar11 = (long)height;
        puVar21 = data + (lVar16 * lVar11 - lVar22);
        do {
          memcpy(puVar21,data + -lVar22 + (height + -1) * lVar16,(long)(width + border_horz * 2));
          lVar11 = lVar11 + 1;
          puVar21 = puVar21 + lVar16;
        } while (lVar11 < border_vert + height);
      }
    }
  }
  else {
    lVar16 = (long)data * 2;
    lVar11 = (long)stride;
    if (0 < height) {
      lVar12 = (long)width;
      lVar22 = (long)(border_horz + width);
      if ((long)(border_horz + width) < lVar12 + 1) {
        lVar22 = lVar12 + 1;
      }
      lVar17 = (lVar22 - lVar12) + -1;
      auVar23._8_4_ = (int)lVar17;
      auVar23._0_8_ = lVar17;
      auVar23._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar18 = lVar16 + lVar12 * 2 + 0xe;
      uVar19 = 0;
      auVar23 = auVar23 ^ _DAT_004d1710;
      lVar17 = lVar16;
      do {
        if (0 < border_horz) {
          puVar1 = (undefined2 *)(lVar16 + uVar19 * lVar11 * 2);
          lVar13 = (long)-border_horz;
          do {
            lVar13 = lVar13 + 1;
            *(undefined2 *)(lVar17 + -2 + lVar13 * 2) = *puVar1;
          } while ((int)lVar13 != 0);
          if (0 < border_horz) {
            uVar14 = 0;
            do {
              auVar35._8_4_ = (int)uVar14;
              auVar35._0_8_ = uVar14;
              auVar35._12_4_ = (int)(uVar14 >> 0x20);
              auVar27 = (auVar35 | auVar7) ^ auVar8;
              iVar36 = auVar23._0_4_;
              iVar42 = -(uint)(iVar36 < auVar27._0_4_);
              iVar24 = auVar23._4_4_;
              auVar28._4_4_ = -(uint)(iVar24 < auVar27._4_4_);
              iVar41 = auVar23._8_4_;
              iVar44 = -(uint)(iVar41 < auVar27._8_4_);
              iVar25 = auVar23._12_4_;
              auVar28._12_4_ = -(uint)(iVar25 < auVar27._12_4_);
              auVar38._4_4_ = iVar42;
              auVar38._0_4_ = iVar42;
              auVar38._8_4_ = iVar44;
              auVar38._12_4_ = iVar44;
              auVar45 = pshuflw(in_XMM11,auVar38,0xe8);
              auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar24);
              auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar25);
              auVar30._0_4_ = auVar30._4_4_;
              auVar30._8_4_ = auVar30._12_4_;
              auVar47 = pshuflw(in_XMM12,auVar30,0xe8);
              auVar28._0_4_ = auVar28._4_4_;
              auVar28._8_4_ = auVar28._12_4_;
              auVar46 = pshuflw(auVar45,auVar28,0xe8);
              auVar27._8_4_ = 0xffffffff;
              auVar27._0_8_ = 0xffffffffffffffff;
              auVar27._12_4_ = 0xffffffff;
              auVar27 = (auVar46 | auVar47 & auVar45) ^ auVar27;
              auVar27 = packssdw(auVar27,auVar27);
              uVar2 = puVar1[lVar12 + -1];
              if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -0xe + uVar14 * 2) = uVar2;
              }
              auVar28 = auVar30 & auVar38 | auVar28;
              auVar27 = packssdw(auVar28,auVar28);
              auVar46._8_4_ = 0xffffffff;
              auVar46._0_8_ = 0xffffffffffffffff;
              auVar46._12_4_ = 0xffffffff;
              auVar27 = packssdw(auVar27 ^ auVar46,auVar27 ^ auVar46);
              if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)(lVar18 + -0xc + uVar14 * 2) = uVar2;
              }
              auVar27 = (auVar35 | auVar6) ^ auVar8;
              iVar42 = -(uint)(iVar36 < auVar27._0_4_);
              auVar43._4_4_ = -(uint)(iVar24 < auVar27._4_4_);
              iVar44 = -(uint)(iVar41 < auVar27._8_4_);
              auVar43._12_4_ = -(uint)(iVar25 < auVar27._12_4_);
              auVar29._4_4_ = iVar42;
              auVar29._0_4_ = iVar42;
              auVar29._8_4_ = iVar44;
              auVar29._12_4_ = iVar44;
              auVar37._4_4_ = -(uint)(auVar27._4_4_ == iVar24);
              auVar37._12_4_ = -(uint)(auVar27._12_4_ == iVar25);
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar43._0_4_ = auVar43._4_4_;
              auVar43._8_4_ = auVar43._12_4_;
              auVar27 = auVar37 & auVar29 | auVar43;
              auVar27 = packssdw(auVar27,auVar27);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar27 = packssdw(auVar27 ^ auVar3,auVar27 ^ auVar3);
              if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -10 + uVar14 * 2) = uVar2;
              }
              auVar30 = pshufhw(auVar29,auVar29,0x84);
              auVar38 = pshufhw(auVar37,auVar37,0x84);
              auVar28 = pshufhw(auVar30,auVar43,0x84);
              auVar31._8_4_ = 0xffffffff;
              auVar31._0_8_ = 0xffffffffffffffff;
              auVar31._12_4_ = 0xffffffff;
              auVar31 = (auVar28 | auVar38 & auVar30) ^ auVar31;
              auVar30 = packssdw(auVar31,auVar31);
              if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -8 + uVar14 * 2) = uVar2;
              }
              auVar30 = (auVar35 | auVar10) ^ auVar8;
              iVar42 = -(uint)(iVar36 < auVar30._0_4_);
              auVar33._4_4_ = -(uint)(iVar24 < auVar30._4_4_);
              iVar44 = -(uint)(iVar41 < auVar30._8_4_);
              auVar33._12_4_ = -(uint)(iVar25 < auVar30._12_4_);
              auVar39._4_4_ = iVar42;
              auVar39._0_4_ = iVar42;
              auVar39._8_4_ = iVar44;
              auVar39._12_4_ = iVar44;
              auVar27 = pshuflw(auVar27,auVar39,0xe8);
              auVar32._4_4_ = -(uint)(auVar30._4_4_ == iVar24);
              auVar32._12_4_ = -(uint)(auVar30._12_4_ == iVar25);
              auVar32._0_4_ = auVar32._4_4_;
              auVar32._8_4_ = auVar32._12_4_;
              auVar30 = pshuflw(auVar47 & auVar45,auVar32,0xe8);
              in_XMM12 = auVar30 & auVar27;
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar27 = pshuflw(auVar27,auVar33,0xe8);
              auVar45._8_4_ = 0xffffffff;
              auVar45._0_8_ = 0xffffffffffffffff;
              auVar45._12_4_ = 0xffffffff;
              auVar45 = (auVar27 | in_XMM12) ^ auVar45;
              in_XMM11 = packssdw(auVar45,auVar45);
              if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -6 + uVar14 * 2) = uVar2;
              }
              auVar33 = auVar32 & auVar39 | auVar33;
              auVar27 = packssdw(auVar33,auVar33);
              auVar47._8_4_ = 0xffffffff;
              auVar47._0_8_ = 0xffffffffffffffff;
              auVar47._12_4_ = 0xffffffff;
              auVar27 = packssdw(auVar27 ^ auVar47,auVar27 ^ auVar47);
              if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -4 + uVar14 * 2) = uVar2;
              }
              auVar27 = (auVar35 | auVar9) ^ auVar8;
              iVar36 = -(uint)(iVar36 < auVar27._0_4_);
              auVar40._4_4_ = -(uint)(iVar24 < auVar27._4_4_);
              iVar41 = -(uint)(iVar41 < auVar27._8_4_);
              auVar40._12_4_ = -(uint)(iVar25 < auVar27._12_4_);
              auVar34._4_4_ = iVar36;
              auVar34._0_4_ = iVar36;
              auVar34._8_4_ = iVar41;
              auVar34._12_4_ = iVar41;
              auVar26._4_4_ = -(uint)(auVar27._4_4_ == iVar24);
              auVar26._12_4_ = -(uint)(auVar27._12_4_ == iVar25);
              auVar26._0_4_ = auVar26._4_4_;
              auVar26._8_4_ = auVar26._12_4_;
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar27 = auVar26 & auVar34 | auVar40;
              auVar27 = packssdw(auVar27,auVar27);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar27 = packssdw(auVar27 ^ auVar4,auVar27 ^ auVar4);
              if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + -2 + uVar14 * 2) = uVar2;
              }
              auVar35 = pshufhw(auVar34,auVar34,0x84);
              auVar27 = pshufhw(auVar26,auVar26,0x84);
              auVar30 = pshufhw(auVar35,auVar40,0x84);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar27 = packssdw(auVar27 & auVar35,(auVar30 | auVar27 & auVar35) ^ auVar5);
              if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(lVar18 + uVar14 * 2) = uVar2;
              }
              uVar14 = uVar14 + 8;
            } while (((lVar22 - lVar12) + 7U & 0xfffffffffffffff8) != uVar14);
          }
        }
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + lVar11 * 2;
        lVar18 = lVar18 + lVar11 * 2;
      } while (uVar19 != (uint)height);
    }
    if (0 < border_vert) {
      lVar12 = (long)border_horz;
      __src = (void *)(lVar16 + lVar12 * -2);
      lVar22 = -(long)border_vert;
      pvVar15 = (void *)(lVar16 - (lVar12 * 2 + border_vert * lVar11 * 2));
      do {
        lVar22 = lVar22 + 1;
        memcpy(pvVar15,__src,(long)(width + border_horz * 2) * 2);
        pvVar15 = (void *)((long)pvVar15 + lVar11 * 2);
      } while ((int)lVar22 != 0);
      if (0 < border_vert) {
        lVar22 = (long)height;
        pvVar15 = (void *)(lVar16 + lVar11 * lVar22 * 2 + lVar12 * -2);
        do {
          memcpy(pvVar15,(void *)((long)__src + (height + -1) * lVar11 * 2),
                 (long)(width + border_horz * 2) * 2);
          lVar22 = lVar22 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar11 * 2);
        } while (lVar22 < border_vert + height);
      }
    }
  }
  return;
}

Assistant:

void av1_extend_frame(uint8_t *data, int width, int height, int stride,
                      int border_horz, int border_vert, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    extend_frame_highbd(CONVERT_TO_SHORTPTR(data), width, height, stride,
                        border_horz, border_vert);
    return;
  }
#endif
  (void)highbd;
  extend_frame_lowbd(data, width, height, stride, border_horz, border_vert);
}